

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * GetBitcoinUtxoList(void)

{
  uchar *puVar1;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RDI;
  Utxo utxo_6;
  Txid txid_6;
  Utxo utxo_5;
  Txid txid_5;
  Utxo utxo_4;
  Txid txid_4;
  Utxo utxo_3;
  Txid txid_3;
  Utxo utxo_2;
  Txid txid_2;
  Utxo utxo_1;
  Txid txid_1;
  Utxo utxo;
  Txid txid;
  uint16_t scriptsig_size;
  uint16_t witness_size;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *utxos;
  value_type *in_stack_fffffffffffff558;
  value_type *__x;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff560;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *this;
  ByteData local_958;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_940;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  ulong uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  allocator local_849;
  string local_848;
  Txid local_828;
  ByteData local_808;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_7f0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  ulong uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  allocator local_6f9;
  string local_6f8;
  Txid local_6d8;
  ByteData local_6b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_6a0;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  ulong uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  allocator local_5a9;
  string local_5a8;
  Txid local_588;
  ByteData local_568;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_550;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  ulong uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  allocator local_459;
  string local_458;
  Txid local_438;
  ByteData local_418;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_400;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  ulong uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  allocator local_309;
  string local_308;
  Txid local_2e8;
  ByteData local_2c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  allocator local_1b9;
  string local_1b8;
  Txid local_198;
  ByteData local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_160;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  allocator local_51;
  string local_50;
  Txid local_30;
  undefined1 local_d;
  undefined2 local_c;
  undefined2 local_a;
  
  local_a = 0x6a;
  local_c = 0x16;
  local_d = 0;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x25bff3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
             &local_51);
  cfd::core::Txid::Txid(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_78 = 0;
  cfd::core::Txid::GetData(&local_178,&local_30);
  cfd::core::ByteData::GetBytes(&local_160,&local_178);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x25c129);
  uStack_120 = *(undefined8 *)puVar1;
  local_118 = *(undefined8 *)(puVar1 + 8);
  uStack_110 = *(undefined8 *)(puVar1 + 0x10);
  local_108 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff560);
  cfd::core::ByteData::~ByteData((ByteData *)0x25c15c);
  uStack_100 = uStack_100 & 0xffffffff00000000;
  local_c8 = 0x12a05f20;
  uStack_d0 = CONCAT44(uStack_d0._4_4_,0x16006a);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  cfd::core::Txid::~Txid((Txid *)0x25c1ab);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b8,"30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a"
             ,&local_1b9);
  cfd::core::Txid::Txid(&local_198,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_1c8 = 0;
  cfd::core::Txid::GetData(&local_2c8,&local_198);
  cfd::core::ByteData::GetBytes(&local_2b0,&local_2c8);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x25c2e1);
  uStack_270 = *(undefined8 *)puVar1;
  local_268 = *(undefined8 *)(puVar1 + 8);
  uStack_260 = *(undefined8 *)(puVar1 + 0x10);
  local_258 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff560);
  cfd::core::ByteData::~ByteData((ByteData *)0x25c314);
  uStack_250 = uStack_250 & 0xffffffff00000000;
  local_218 = 0x4a817c8;
  uStack_220 = CONCAT44(uStack_220._4_4_,0x16006a);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  cfd::core::Txid::~Txid((Txid *)0x25c363);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_308,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a"
             ,&local_309);
  cfd::core::Txid::Txid(&local_2e8,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  local_328 = 0;
  uStack_320 = 0;
  local_338 = 0;
  uStack_330 = 0;
  local_348 = 0;
  uStack_340 = 0;
  local_358 = 0;
  uStack_350 = 0;
  local_368 = 0;
  uStack_360 = 0;
  local_378 = 0;
  uStack_370 = 0;
  local_388 = 0;
  uStack_380 = 0;
  local_398 = 0;
  uStack_390 = 0;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_3b8 = 0;
  uStack_3b0 = 0;
  local_3c8 = 0;
  uStack_3c0 = 0;
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_318 = 0;
  cfd::core::Txid::GetData(&local_418,&local_2e8);
  cfd::core::ByteData::GetBytes(&local_400,&local_418);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x25c499);
  uStack_3c0 = *(undefined8 *)puVar1;
  local_3b8 = *(undefined8 *)(puVar1 + 8);
  uStack_3b0 = *(undefined8 *)(puVar1 + 0x10);
  local_3a8 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff560);
  cfd::core::ByteData::~ByteData((ByteData *)0x25c4cc);
  uStack_3a0 = uStack_3a0 & 0xffffffff00000000;
  local_368 = 1250000000;
  uStack_370 = CONCAT44(uStack_370._4_4_,0x16006a);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  cfd::core::Txid::~Txid((Txid *)0x25c51b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_458,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a"
             ,&local_459);
  cfd::core::Txid::Txid(&local_438,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  local_478 = 0;
  uStack_470 = 0;
  local_488 = 0;
  uStack_480 = 0;
  local_498 = 0;
  uStack_490 = 0;
  local_4a8 = 0;
  uStack_4a0 = 0;
  local_4b8 = 0;
  uStack_4b0 = 0;
  local_4c8 = 0;
  uStack_4c0 = 0;
  local_4d8 = 0;
  uStack_4d0 = 0;
  local_4e8 = 0;
  uStack_4e0 = 0;
  local_4f8 = 0;
  uStack_4f0 = 0;
  local_508 = 0;
  uStack_500 = 0;
  local_518 = 0;
  uStack_510 = 0;
  local_528 = 0;
  uStack_520 = 0;
  local_538 = 0;
  uStack_530 = 0;
  local_468 = 0;
  cfd::core::Txid::GetData(&local_568,&local_438);
  cfd::core::ByteData::GetBytes(&local_550,&local_568);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x25c651);
  uStack_510 = *(undefined8 *)puVar1;
  local_508 = *(undefined8 *)(puVar1 + 8);
  uStack_500 = *(undefined8 *)(puVar1 + 0x10);
  local_4f8 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff560);
  cfd::core::ByteData::~ByteData((ByteData *)0x25c684);
  uStack_4f0 = uStack_4f0 & 0xffffffff00000000;
  local_4b8 = 0x2540be4;
  uStack_4c0 = CONCAT44(uStack_4c0._4_4_,0x16006a);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  cfd::core::Txid::~Txid((Txid *)0x25c6d3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a8,"4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a"
             ,&local_5a9);
  cfd::core::Txid::Txid(&local_588,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  local_5c8 = 0;
  uStack_5c0 = 0;
  local_5d8 = 0;
  uStack_5d0 = 0;
  local_5e8 = 0;
  uStack_5e0 = 0;
  local_5f8 = 0;
  uStack_5f0 = 0;
  local_608 = 0;
  uStack_600 = 0;
  local_618 = 0;
  uStack_610 = 0;
  local_628 = 0;
  uStack_620 = 0;
  local_638 = 0;
  uStack_630 = 0;
  local_648 = 0;
  uStack_640 = 0;
  local_658 = 0;
  uStack_650 = 0;
  local_668 = 0;
  uStack_660 = 0;
  local_678 = 0;
  uStack_670 = 0;
  local_688 = 0;
  uStack_680 = 0;
  local_5b8 = 0;
  cfd::core::Txid::GetData(&local_6b8,&local_588);
  cfd::core::ByteData::GetBytes(&local_6a0,&local_6b8);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x25c803);
  uStack_660 = *(undefined8 *)puVar1;
  local_658 = *(undefined8 *)(puVar1 + 8);
  uStack_650 = *(undefined8 *)(puVar1 + 0x10);
  local_648 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff560);
  cfd::core::ByteData::~ByteData((ByteData *)0x25c833);
  uStack_640 = uStack_640 & 0xffffffff00000000;
  local_608 = 0x9502f90;
  uStack_610 = CONCAT44(uStack_610._4_4_,0x16006a);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  cfd::core::Txid::~Txid((Txid *)0x25c882);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6f8,"b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b"
             ,&local_6f9);
  cfd::core::Txid::Txid(&local_6d8,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  local_718 = 0;
  uStack_710 = 0;
  local_728 = 0;
  uStack_720 = 0;
  local_738 = 0;
  uStack_730 = 0;
  local_748 = 0;
  uStack_740 = 0;
  local_758 = 0;
  uStack_750 = 0;
  local_768 = 0;
  uStack_760 = 0;
  local_778 = 0;
  uStack_770 = 0;
  local_788 = 0;
  uStack_780 = 0;
  local_798 = 0;
  uStack_790 = 0;
  local_7a8 = 0;
  uStack_7a0 = 0;
  local_7b8 = 0;
  uStack_7b0 = 0;
  local_7c8 = 0;
  uStack_7c0 = 0;
  local_7d8 = 0;
  uStack_7d0 = 0;
  local_708 = 0;
  cfd::core::Txid::GetData(&local_808,&local_6d8);
  cfd::core::ByteData::GetBytes(&local_7f0,&local_808);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x25c9a9);
  uStack_7b0 = *(undefined8 *)puVar1;
  local_7a8 = *(undefined8 *)(puVar1 + 8);
  uStack_7a0 = *(undefined8 *)(puVar1 + 0x10);
  local_798 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff560);
  cfd::core::ByteData::~ByteData((ByteData *)0x25c9d6);
  uStack_790 = uStack_790 & 0xffffffff00000000;
  local_758 = 2500000000;
  uStack_760 = CONCAT44(uStack_760._4_4_,0x16006a);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  cfd::core::Txid::~Txid((Txid *)0x25ca26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_848,"0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c"
             ,&local_849);
  cfd::core::Txid::Txid(&local_828,&local_848);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  __x = (value_type *)0x0;
  this = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x0;
  local_868 = 0;
  uStack_860 = 0;
  local_878 = 0;
  uStack_870 = 0;
  local_888 = 0;
  uStack_880 = 0;
  local_898 = 0;
  uStack_890 = 0;
  local_8a8 = 0;
  uStack_8a0 = 0;
  local_8b8 = 0;
  uStack_8b0 = 0;
  local_8c8 = 0;
  uStack_8c0 = 0;
  local_8d8 = 0;
  uStack_8d0 = 0;
  local_8e8 = 0;
  uStack_8e0 = 0;
  local_8f8 = 0;
  uStack_8f0 = 0;
  local_908 = 0;
  uStack_900 = 0;
  local_918 = 0;
  uStack_910 = 0;
  local_928 = 0;
  uStack_920 = 0;
  local_858 = 0;
  cfd::core::Txid::GetData(&local_958,&local_828);
  cfd::core::ByteData::GetBytes(&local_940,&local_958);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x25cb4d);
  uStack_900 = *(undefined8 *)puVar1;
  local_8f8 = *(undefined8 *)(puVar1 + 8);
  uStack_8f0 = *(undefined8 *)(puVar1 + 0x10);
  local_8e8 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  cfd::core::ByteData::~ByteData((ByteData *)0x25cb7a);
  uStack_8e0 = uStack_8e0 & 0xffffffff00000000;
  local_8a8 = 5000000000;
  uStack_8b0 = CONCAT44(uStack_8b0._4_4_,0x16006a);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(this,__x);
  cfd::core::Txid::~Txid((Txid *)0x25cbcf);
  return in_RDI;
}

Assistant:

static std::vector<Utxo> GetBitcoinUtxoList() {
  // std::string desc = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
  constexpr uint16_t witness_size = 106; // 71 + 33 + 2
  constexpr uint16_t scriptsig_size = 22; // 20 + 2

  std::vector<Utxo> utxos;
  {
    Txid txid("7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 312500000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 78125000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 1250000000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 39062500;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 156250000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 2500000000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 5000000000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  return utxos;
}